

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

CURLcode ssl_connect_init_proxy(connectdata *conn,int sockindex)

{
  ssl_backend_data *__s;
  ssl_connect_state sVar1;
  ssl_connect_data *psVar2;
  ssl_connect_data *psVar3;
  ssl_backend_data *pbdata;
  int sockindex_local;
  connectdata *conn_local;
  
  if ((conn->ssl[sockindex].state == ssl_connection_complete) &&
     ((conn->proxy_ssl[sockindex].field_0x10 & 1) == 0)) {
    if ((Curl_ssl->supports & 0x10) == 0) {
      return CURLE_NOT_BUILT_IN;
    }
    __s = conn->proxy_ssl[sockindex].backend;
    psVar2 = conn->proxy_ssl + sockindex;
    psVar3 = conn->ssl + sockindex;
    sVar1 = psVar3->connecting_state;
    psVar2->state = psVar3->state;
    psVar2->connecting_state = sVar1;
    psVar2->backend = psVar3->backend;
    *(undefined8 *)&psVar2->field_0x10 = *(undefined8 *)&psVar3->field_0x10;
    memset(conn->ssl + sockindex,0,0x18);
    memset(__s,0,Curl_ssl->sizeof_ssl_backend_data);
    conn->ssl[sockindex].backend = __s;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode
ssl_connect_init_proxy(struct connectdata *conn, int sockindex)
{
  DEBUGASSERT(conn->bits.proxy_ssl_connected[sockindex]);
  if(ssl_connection_complete == conn->ssl[sockindex].state &&
     !conn->proxy_ssl[sockindex].use) {
    struct ssl_backend_data *pbdata;

    if(!(Curl_ssl->supports & SSLSUPP_HTTPS_PROXY))
      return CURLE_NOT_BUILT_IN;

    /* The pointers to the ssl backend data, which is opaque here, are swapped
       rather than move the contents. */
    pbdata = conn->proxy_ssl[sockindex].backend;
    conn->proxy_ssl[sockindex] = conn->ssl[sockindex];

    DEBUGASSERT(pbdata != NULL);

    memset(&conn->ssl[sockindex], 0, sizeof(conn->ssl[sockindex]));
    memset(pbdata, 0, Curl_ssl->sizeof_ssl_backend_data);

    conn->ssl[sockindex].backend = pbdata;
  }
  return CURLE_OK;
}